

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

string * __thiscall
helics::CommonCore::getInjectionType_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  char cVar1;
  pair<helics::route_id,_helics::ActionMessage> *ppVar2;
  FederateState *pFVar3;
  InputInfo *this_00;
  string *psVar4;
  
  ppVar2 = getHandleInfo(this,handle);
  if (ppVar2 != (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    cVar1 = (char)(ppVar2->second).messageID;
    if (cVar1 == 'e') {
      return (string *)&(ppVar2->second).Te;
    }
    if (cVar1 == 'f') {
      return *(string **)((ppVar2->second).payload.buffer._M_elems + 0x28);
    }
    if (cVar1 == 'i') {
      pFVar3 = getFederateAt(this,(LocalFederateId)(ppVar2->second).messageAction);
      this_00 = InterfaceInfo::getInput(&pFVar3->interfaceInformation,handle);
      if (this_00 != (InputInfo *)0x0) {
        psVar4 = InputInfo::getInjectionType_abi_cxx11_(this_00);
        return psVar4;
      }
    }
  }
  return (string *)&gEmptyString_abi_cxx11_;
}

Assistant:

const std::string& CommonCore::getInjectionType(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getInjectionType();
                }
                break;
            }
            case InterfaceType::ENDPOINT:
                return handleInfo->type;
            case InterfaceType::FILTER:
                return handleInfo->type_in;
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}